

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O3

void __thiscall FC_BPNN::clear(FC_BPNN *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pvVar1 = (this->layers_value).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->layers_value).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 3) * -0x5555555555555555;
    pvVar2 = (this->layers_error).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      lVar3 = *(long *)&pvVar1[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl;
      lVar7 = (long)*(pointer *)
                     ((long)&pvVar1[lVar6].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl + 8) - lVar3;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 3;
        lVar4 = *(long *)&pvVar2[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar8 = 0;
        do {
          *(undefined8 *)(lVar3 + lVar8 * 8) = 0;
          *(undefined8 *)(lVar4 + lVar8 * 8) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
  }
  return;
}

Assistant:

void FC_BPNN::clear()
{
	for (int i = 0; i < layers_value.size(); i++) {
		for (int j = 0; j < layers_value[i].size(); j++) {
			layers_value[i][j] = 0.0;
			layers_error[i][j] = 0.0;
		}
	}
}